

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colormapper.h
# Opt level: O0

vector<float,_std::allocator<float>_> *
irwincolor::msh2rgb(vector<float,_std::allocator<float>_> *__return_storage_ptr__,
                   vector<float,_std::allocator<float>_> *msh)

{
  double dVar1;
  reference pvVar2;
  double *pdVar3;
  double local_90;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50 [3];
  vector<float,_std::allocator<float>_> local_38;
  undefined1 local_19;
  vector<float,_std::allocator<float>_> *local_18;
  vector<float,_std::allocator<float>_> *msh_local;
  vector<float,_std::allocator<float>_> *rgb;
  
  local_19 = 0;
  local_18 = msh;
  msh_local = __return_storage_ptr__;
  msh2lab(&local_38,msh);
  lab2rgb(__return_storage_ptr__,&local_38);
  std::vector<float,_std::allocator<float>_>::~vector(&local_38);
  pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](__return_storage_ptr__,0);
  local_50[0] = (double)*pvVar2;
  local_58 = 0.0;
  pdVar3 = std::max<double>(local_50,&local_58);
  local_60 = 1.0;
  pdVar3 = std::min<double>(pdVar3,&local_60);
  dVar1 = *pdVar3;
  pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](__return_storage_ptr__,0);
  *pvVar2 = (float)dVar1;
  pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](__return_storage_ptr__,1);
  local_68 = (double)*pvVar2;
  local_70 = 0.0;
  pdVar3 = std::max<double>(&local_68,&local_70);
  local_78 = 1.0;
  pdVar3 = std::min<double>(pdVar3,&local_78);
  dVar1 = *pdVar3;
  pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](__return_storage_ptr__,1);
  *pvVar2 = (float)dVar1;
  pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](__return_storage_ptr__,2);
  local_80 = (double)*pvVar2;
  local_88 = 0.0;
  pdVar3 = std::max<double>(&local_80,&local_88);
  local_90 = 1.0;
  pdVar3 = std::min<double>(pdVar3,&local_90);
  dVar1 = *pdVar3;
  pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](__return_storage_ptr__,2);
  *pvVar2 = (float)dVar1;
  return __return_storage_ptr__;
}

Assistant:

std::vector<float> msh2rgb(const std::vector<float>& msh)
{
	auto rgb = lab2rgb(msh2lab(msh));
	rgb[0] = std::min(std::max((double) rgb[0], 0.0), 1.0);
	rgb[1] = std::min(std::max((double) rgb[1], 0.0), 1.0);
	rgb[2] = std::min(std::max((double) rgb[2], 0.0), 1.0);
	return rgb;
	//return lab2rgb(msh2lab(msh));
}